

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O2

int Lodtalk::identityHashOf(Oop obj)

{
  SmallIntegerValue SVar1;
  uint uVar2;
  uint *in_RDI;
  Oop local_8;
  
  if (((ulong)in_RDI & 1) == 0) {
    uVar2 = (uint)in_RDI & 6;
    if (uVar2 == 4) {
      uVar2 = (uint)((ulong)in_RDI >> 3);
    }
    else if (uVar2 == 2) {
      uVar2 = Oop::decodeCharacter(&local_8);
    }
    else {
      uVar2 = *in_RDI >> 10;
    }
  }
  else {
    SVar1 = Oop::decodeSmallInteger(&local_8);
    uVar2 = (uint)SVar1;
  }
  return uVar2;
}

Assistant:

inline int identityHashOf(Oop obj)
{
	if(obj.isSmallInteger())
		return (int)obj.decodeSmallInteger();
    else if (obj.isCharacter())
        return obj.decodeCharacter();
    else if (obj.isSmallFloat())
        return int(obj.uintValue >> ObjectTag::SmallFloatShift);
	return obj.header->identityHash;
}